

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2Reverb::render(V2Reverb *this,StereoSample *dest,int nsamples)

{
  V2Instance *pVVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  float fVar6;
  ulong uVar7;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  if (0 < nsamples) {
    pVVar1 = this->inst;
    uVar7 = 0;
    do {
      fVar11 = pVVar1->aux1buf[uVar7] * this->gainin + 3.8146973e-06;
      lVar4 = 0;
      bVar3 = true;
      do {
        bVar8 = bVar3;
        lVar9 = lVar4 << 4;
        fVar12 = 0.0;
        uVar10 = 0;
        do {
          fVar14 = fVar11;
          if ((uVar10 & 1) != 0) {
            fVar14 = -fVar11;
          }
          fVar6 = this->gaina[lVar9 + 6];
          fVar13 = *(float *)((long)this->combl[0] + lVar9);
          fVar13 = ((this->gainc[uVar10] *
                     *(float *)(*(long *)(this->gaina + lVar9 + 8) + (ulong)(uint)fVar6 * 4) +
                    fVar14) - fVar13) * this->damp + fVar13;
          *(float *)(*(long *)(this->gaina + lVar9 + 8) + (ulong)(uint)fVar6 * 4) = fVar13;
          fVar6 = (float)((int)fVar6 + 1);
          if (fVar6 == this->gaina[lVar9 + 7]) {
            fVar6 = 0.0;
          }
          this->gaina[lVar9 + 6] = fVar6;
          fVar12 = fVar12 + fVar13;
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 4;
        } while (uVar10 != 4);
        lVar9 = 0;
        bVar3 = true;
        do {
          bVar5 = bVar3;
          lVar2 = *(long *)(this->combl[lVar4 * 2 + lVar9 + 2] + 2);
          fVar13 = this->combl[lVar4 * 2 + lVar9 + 2][0];
          fVar14 = *(float *)(lVar2 + (ulong)(uint)fVar13 * 4);
          fVar12 = this->gaina[lVar9] * fVar14 + fVar12;
          *(float *)(lVar2 + (ulong)(uint)fVar13 * 4) = fVar12;
          fVar13 = (float)((int)fVar13 + 1);
          if (fVar13 == this->combl[lVar4 * 2 + lVar9 + 2][1]) {
            fVar13 = 0.0;
          }
          this->combl[lVar4 * 2 + lVar9 + 2][0] = fVar13;
          fVar12 = fVar14 - fVar12 * this->gaina[lVar9];
          lVar9 = 1;
          bVar3 = false;
        } while (bVar5);
        fVar14 = (fVar12 - this->hpf[lVar4]) * this->lowcut + this->hpf[lVar4];
        this->hpf[lVar4] = fVar14;
        dest->ch[uVar7 * 2 + lVar4] = (fVar12 - fVar14) + dest->ch[uVar7 * 2 + lVar4];
        lVar4 = 1;
        bVar3 = false;
      } while (bVar8);
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)nsamples);
  }
  return;
}

Assistant:

void render(StereoSample *dest, int nsamples)
    {
        const float *inbuf = inst->aux1buf;

        COVER("RVB render");

        for (int i=0; i < nsamples; i++)
        {
            float in = inbuf[i] * gainin + fcdcoffset;

            for (int ch=0; ch < 2; ch++)
            {
                // parallel comb filters
                float cur = 0.0f;
                for (int j=0; j < 4; j++)
                {
                    float dv = gainc[j] * combd[ch][j].fetch();
                    float nv = (j & 1) ? (dv - in) : (dv + in); // alternate phase on combs
                    float lp = combl[ch][j] + damp * (nv - combl[ch][j]);
                    combd[ch][j].feed(lp);
                    cur += lp;
                }

                // serial allpass filters
                for (int j=0; j < 2; j++)
                {
                    float dv = alld[ch][j].fetch();
                    float dz = cur + gaina[j] * dv;
                    alld[ch][j].feed(dz);
                    cur = dv - gaina[j] * dz;
                }

                // low cut and output
                hpf[ch] += lowcut * (cur - hpf[ch]);
                dest[i].ch[ch] += cur - hpf[ch];
            }
        }
    }